

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::NodeRef>::reallocateTo
          (SmallVectorBase<slang::IntervalMapDetails::NodeRef> *this,size_type newCapacity)

{
  NodeRef *__last;
  EVP_PKEY_CTX *ctx;
  NodeRef *in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> *in_RDI;
  pointer newData;
  
  __last = (NodeRef *)operator_new(0xa49066);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::uninitialized_move<slang::IntervalMapDetails::NodeRef*,slang::IntervalMapDetails::NodeRef*>
            (in_RSI,__last,(NodeRef *)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }